

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[8],unsigned_short,char>
          (JObject *this,char (*k) [8],unsigned_short *v,char *c)

{
  ostream *os;
  char (*local_40) [8];
  Field<char[8],_unsigned_short> field;
  
  local_40 = k;
  field.k = (char (*) [8])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (unsigned_short *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[8],_unsigned_short>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }